

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O1

int CreateBotDist(DdNode *node,st__table *pathTable,uint *pathLengthArray,FILE *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int *key;
  uint uVar7;
  size_t __size;
  char *__ptr;
  NodeDist_t *nodeStat;
  NodeDist_t *nodeStatChild;
  int *local_50;
  uint local_44;
  char *local_40;
  ulong local_38;
  
  key = (int *)((ulong)node & 0xfffffffffffffffe);
  iVar2 = 1;
  if (*key != 0x7fffffff) {
    iVar2 = st__lookup(pathTable,(char *)key,(char **)&local_50);
    if (iVar2 == 0) {
      __ptr = "Something wrong, the entry doesn\'t exist\n";
      __size = 0x29;
LAB_0079375d:
      fwrite(__ptr,__size,1,(FILE *)fp);
LAB_0079376c:
      iVar2 = 0;
    }
    else {
      local_44 = 0xffffffff;
      uVar5 = 0xffffffff;
      if ((*local_50 != -1) && (uVar5 = *local_50 + local_50[2], local_50[2] == -1)) {
        uVar5 = 0xffffffff;
      }
      if ((local_50[1] != -1) && (local_44 = local_50[1] + local_50[3], local_50[3] == -1)) {
        local_44 = 0xffffffff;
      }
      if (uVar5 < local_44) {
        local_44 = uVar5;
      }
      uVar4 = *(ulong *)(key + 4);
      uVar1 = *(ulong *)(key + 6);
      local_38 = (ulong)((uint)node & 1);
      for (iVar2 = 0; (uVar6 = uVar4, iVar2 == 0 || (uVar6 = uVar1, iVar2 != 2)); iVar2 = iVar2 + 1)
      {
        if (*(int *)(uVar6 & 0xfffffffffffffffe) == 0x7fffffff) {
          if ((uVar6 & 1) == 0) {
            local_50[3] = 1;
          }
          else {
            local_50[2] = 1;
          }
        }
        else {
          iVar3 = st__lookup(pathTable,(char *)(uVar6 & 0xfffffffffffffffe),&local_40);
          if (iVar3 == 0) {
            __ptr = "Something wrong, node in table should have been created in top dist proc.\n";
            __size = 0x4a;
            goto LAB_0079375d;
          }
          if (*(int *)(local_40 + 8) == -1) {
            if (*(int *)(local_40 + 0xc) != -1) {
              __ptr = "Something wrong, both bot nodeStats should be there\n";
              __size = 0x34;
              goto LAB_0079375d;
            }
            iVar3 = CreateBotDist((DdNode *)(local_38 ^ uVar6),pathTable,pathLengthArray,fp);
            if (iVar3 == 0) goto LAB_0079376c;
          }
          uVar5 = 0xffffffff;
          if ((uVar6 & 1) == 0) {
            uVar7 = *(int *)(local_40 + 0xc) + 1U;
            if (*(int *)(local_40 + 0xc) + 1U == 0) {
              uVar7 = uVar5;
            }
            if (uVar7 < (uint)local_50[3]) {
              local_50[3] = uVar7;
            }
            iVar3 = *(int *)(local_40 + 8);
          }
          else {
            uVar7 = *(int *)(local_40 + 8) + 1U;
            if (*(int *)(local_40 + 8) + 1U == 0) {
              uVar7 = uVar5;
            }
            if (uVar7 < (uint)local_50[3]) {
              local_50[3] = uVar7;
            }
            iVar3 = *(int *)(local_40 + 0xc);
          }
          uVar7 = iVar3 + 1U;
          if (iVar3 + 1U == 0) {
            uVar7 = uVar5;
          }
          if (uVar7 < (uint)local_50[2]) {
            local_50[2] = uVar7;
          }
        }
      }
      uVar5 = 0xffffffff;
      uVar4 = 0xffffffff;
      if (*local_50 != -1) {
        uVar7 = *local_50 + local_50[2];
        if (local_50[2] == -1) {
          uVar7 = 0xffffffff;
        }
        uVar4 = (ulong)uVar7;
      }
      uVar7 = (uint)uVar4;
      iVar2 = 1;
      if ((local_50[1] != -1) && (uVar5 = local_50[1] + local_50[3], local_50[3] == -1)) {
        uVar5 = 0xffffffff;
      }
      if (uVar7 < local_44) {
        if (local_44 != 0xffffffff) {
          pathLengthArray[local_44] = pathLengthArray[local_44] - 1;
        }
        local_44 = uVar7;
        if (uVar7 != 0xffffffff) {
          pathLengthArray[uVar4] = pathLengthArray[uVar4] + 1;
        }
      }
      if (uVar5 < local_44) {
        if (local_44 != 0xffffffff) {
          pathLengthArray[local_44] = pathLengthArray[local_44] - 1;
        }
        if (uVar5 != 0xffffffff) {
          pathLengthArray[uVar5] = pathLengthArray[uVar5] + 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
CreateBotDist(
  DdNode * node /* current node */,
  st__table * pathTable /* path table with path lengths */,
  unsigned int * pathLengthArray /* array that stores number of nodes belonging to a particular path length. */,
  FILE *fp /* where to write messages */)
{
    DdNode *N, *Nv, *Nnv;
    DdNode *realChild;
    DdNode *child, *regChild;
    NodeDist_t *nodeStat, *nodeStatChild;
    unsigned int  oddLen, evenLen, pathLength;
    DdHalfWord botDist;
    int processingDone;

    if (Cudd_IsConstant(node))
        return(1);
    N = Cudd_Regular(node);
    /* each node has one table entry */
    /* update as you go down the min dist of each node from
       the root in each (odd and even) parity */
    if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
        fprintf(fp, "Something wrong, the entry doesn't exist\n");
        return(0);
    }

    /* compute length of odd parity distances */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    /* compute length of even parity distances */
    if (!((nodeStat->evenTopDist == MAXSHORTINT) ||
          (nodeStat->evenBotDist == MAXSHORTINT)))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* assign pathlength to minimum of the two */
    pathLength = (oddLen <= evenLen) ? oddLen : evenLen;

    Nv = Cudd_T(N);
    Nnv = Cudd_E(N);

    /* process each child */
    processingDone = 0;
    while (processingDone != 2) {
        if (!processingDone) {
            child = Nv;
        } else {
            child = Nnv;
        }

        realChild = Cudd_NotCond(child, Cudd_IsComplement(node));
        regChild = Cudd_Regular(child);
        if (Cudd_IsConstant(realChild)) {
            /* Found a minterm; count parity and shortest distance
            ** from the constant.
            */
            if (Cudd_IsComplement(child))
                nodeStat->oddBotDist = 1;
            else
                nodeStat->evenBotDist = 1;
        } else {
            /* If node not in table, recur. */
            if (! st__lookup(pathTable, (const char *)regChild, (char **)&nodeStatChild)) {
                fprintf(fp, "Something wrong, node in table should have been created in top dist proc.\n");
                return(0);
            }

            if (nodeStatChild->oddBotDist == MAXSHORTINT) {
                if (nodeStatChild->evenBotDist == MAXSHORTINT) {
                    if (!CreateBotDist(realChild, pathTable, pathLengthArray, fp))
                        return(0);
                } else {
                    fprintf(fp, "Something wrong, both bot nodeStats should be there\n");
                    return(0);
                }
            }

            /* Update shortest distance from the constant depending on
            **  parity. */

            if (Cudd_IsComplement(child)) {
                /* If parity on the edge then add 1 to even distance
                ** of child to get odd parity distance and add 1 to
                ** odd distance of child to get even parity
                ** distance. Change distance of current node only if
                ** the calculated distance is less than existing
                ** distance. */
                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist )
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;

            } else {
                /* If parity on the edge then add 1 to even distance
                ** of child to get even parity distance and add 1 to
                ** odd distance of child to get odd parity distance.
                ** Change distance of current node only if the
                ** calculated distance is lesser than existing
                ** distance. */
                if (nodeStatChild->evenBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->evenBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->evenBotDist > botDist)
                    nodeStat->evenBotDist = botDist;

                if (nodeStatChild->oddBotDist != MAXSHORTINT)
                    botDist = nodeStatChild->oddBotDist + 1;
                else
                    botDist = MAXSHORTINT;
                if (nodeStat->oddBotDist > botDist)
                    nodeStat->oddBotDist = botDist;
            }
        } /* end of else (if not constant child ) */
        processingDone++;
    } /* end of while processing Nv, Nnv */

    /* Compute shortest path length on the fly. */
    if ((nodeStat->oddTopDist != MAXSHORTINT) &&
        (nodeStat->oddBotDist != MAXSHORTINT))
        oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
    else
        oddLen = MAXSHORTINT;

    if ((nodeStat->evenTopDist != MAXSHORTINT) &&
        (nodeStat->evenBotDist != MAXSHORTINT))
        evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
    else
        evenLen = MAXSHORTINT;

    /* Update path length array that has number of nodes of a particular
    ** path length. */
    if (oddLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (oddLen != MAXSHORTINT)
            pathLengthArray[oddLen]++;
        pathLength = oddLen;
    }
    if (evenLen < pathLength ) {
        if (pathLength != MAXSHORTINT)
            pathLengthArray[pathLength]--;
        if (evenLen != MAXSHORTINT)
            pathLengthArray[evenLen]++;
    }

    return(1);

}